

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  Value *__return_storage_ptr__;
  Expr *pEVar1;
  Module *pMVar2;
  pointer ppDVar3;
  DataSegment *pDVar4;
  pointer pcVar5;
  pointer pNVar6;
  Node *n;
  bool bVar7;
  string *psVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  pointer puVar12;
  ulong uVar13;
  char *__function;
  char cVar14;
  size_t sVar15;
  pointer puVar16;
  _Alloc_hider _Var17;
  Opcode OVar18;
  undefined4 in_register_00000084;
  Address AVar19;
  char cVar20;
  pointer ppDVar21;
  size_type sVar22;
  string_view s;
  string index;
  Value ival;
  string __str;
  string access;
  string local_128;
  size_type local_108;
  char *local_100;
  undefined1 local_f8 [32];
  Address local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [24];
  string local_70;
  string local_50;
  
  OVar18.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_(&local_50,&this->lst,offset,addr_exp);
  if ((local_50._M_string_length != 0) &&
     (iVar10 = std::__cxx11::string::compare((char *)&local_50), iVar10 != 0)) {
    BracketIfNeeded(this,val,Indexing);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"."
                   ,&local_50);
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
    psVar8 = (string *)local_f8;
    _Var17._M_p = (pointer)local_f8._0_8_;
    goto LAB_001583a1;
  }
  pEVar1 = addr_exp->e;
  local_108 = local_50._M_string_length;
  if ((pEVar1 != (Expr *)0x0) && (pEVar1->type_ == Const)) {
    iVar10 = (int)pEVar1[1].loc.filename.size_;
    if (iVar10 == -2) {
      sVar15 = pEVar1[1].loc.field_1.field_1.offset;
    }
    else {
      if (iVar10 != -1) goto LAB_00157d73;
      sVar15 = (size_t)(uint)pEVar1[1].loc.field_1.field_0.line;
    }
    pMVar2 = (this->mc).module;
    ppDVar21 = (pMVar2->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppDVar3 = (pMVar2->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppDVar21 != ppDVar3) {
      puVar16 = (pointer)(sVar15 + offset);
      do {
        pDVar4 = *ppDVar21;
        if ((((pDVar4->offset).size_ == 1) &&
            (pEVar1 = (pDVar4->offset).first_, pEVar1 != (Expr *)0x0)) && (pEVar1->type_ == Const))
        {
          iVar10 = (int)pEVar1[1].loc.filename.size_;
          if (iVar10 == -2) {
            puVar12 = *(pointer *)&pEVar1[1].loc.field_1;
          }
          else {
            if (iVar10 != -1) goto LAB_00157d66;
            puVar12 = (pointer)(ulong)(uint)pEVar1[1].loc.field_1.field_0.line;
          }
          if ((puVar12 <= puVar16) &&
             (puVar16 < (pDVar4->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                        ((long)puVar12 -
                        (long)(pDVar4->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start))) {
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            pcVar5 = (pDVar4->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar5,pcVar5 + (pDVar4->name)._M_string_length);
            local_b8._16_8_ = (pointer)0x0;
            local_b8._0_8_ = (pointer)0x0;
            local_b8._8_8_ = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b8
                       ,&local_128,&local_108);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b8);
            local_f8._24_4_ = Atomic;
            local_88._0_8_ =
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
            local_98._M_allocated_capacity =
                 (size_type)
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_98._8_8_ =
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
            local_f8._0_16_ = ZEXT816(0);
            local_f8._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_98);
            val->precedence = local_f8._24_4_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8);
            offset = (long)puVar16 - (long)puVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
        }
LAB_00157d66:
        ppDVar21 = ppDVar21 + 1;
      } while (ppDVar21 != ppDVar3);
    }
  }
LAB_00157d73:
  uVar11 = offset / align;
  if (offset % align == 0) {
    cVar14 = '\x01';
    if (9 < uVar11) {
      uVar13 = uVar11;
      cVar20 = '\x04';
      do {
        cVar14 = cVar20;
        if (uVar13 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00157f51;
        }
        if (uVar13 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00157f51;
        }
        if (uVar13 < 10000) goto LAB_00157f51;
        bVar7 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar20 = cVar14 + '\x04';
      } while (bVar7);
      cVar14 = cVar14 + '\x01';
    }
LAB_00157f51:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar11);
  }
  else {
    cVar20 = '\x01';
    cVar14 = '\x01';
    if (9 < offset) {
      uVar11 = offset;
      cVar9 = '\x04';
      do {
        cVar14 = cVar9;
        if (uVar11 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00157e5e;
        }
        if (uVar11 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00157e5e;
        }
        if (uVar11 < 10000) goto LAB_00157e5e;
        bVar7 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar9 = cVar14 + '\x04';
      } while (bVar7);
      cVar14 = cVar14 + '\x01';
    }
LAB_00157e5e:
    local_98._M_allocated_capacity = (size_type)local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_98._M_allocated_capacity,local_98._8_4_,offset);
    if (9 < align) {
      AVar19 = align;
      cVar14 = '\x04';
      do {
        cVar20 = cVar14;
        if (AVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_00157ef5;
        }
        if (AVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_00157ef5;
        }
        if (AVar19 < 10000) goto LAB_00157ef5;
        bVar7 = 99999 < AVar19;
        AVar19 = AVar19 / 10000;
        cVar14 = cVar20 + '\x04';
      } while (bVar7);
      cVar20 = cVar20 + '\x01';
    }
LAB_00157ef5:
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_b8,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8._0_8_,local_b8._8_4_,align);
    cat<std::__cxx11::string,char[2],std::__cxx11::string>
              (&local_128,(wabt *)local_98._M_local_buf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"@",
               (char (*) [2])local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar18.enum_));
  }
  sVar22 = local_108;
  if (offset % align != 0) {
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((pointer)local_98._M_allocated_capacity != (pointer)local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
  }
  if (addr_exp->etype == Binary) {
    if (addr_exp->e->type_ != Binary) {
LAB_001583d3:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_001583e8:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                    ,0x48,__function);
    }
    if ((*(int *)&addr_exp->e->field_0x3c == 0x5e) &&
       (pNVar6 = (addr_exp->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start, pNVar6[1].etype == Binary)) {
      if ((pNVar6[1].e)->type_ != Binary) goto LAB_001583d3;
      if ((*(int *)&(pNVar6[1].e)->field_0x3c == 0x68) &&
         (n = pNVar6[1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
              .super__Vector_impl_data._M_start, n[1].etype == Const)) {
        pEVar1 = n[1].e;
        if (pEVar1->type_ != Const) {
          __function = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
          goto LAB_001583e8;
        }
        if (((int)pEVar1[1].loc.filename.size_ == -1) &&
           (1L << (pEVar1[1].loc.field_1.field2[0] & 0x3f) == align)) {
          DecompileExpr((Value *)local_f8,this,n,pNVar6 + 1);
          if (local_f8._8_8_ - local_f8._0_8_ == 0x20) {
            if (offset == 0) {
              std::__cxx11::string::_M_assign((string *)&local_128);
            }
            else {
              BracketIfNeeded(this,(Value *)local_f8,Add);
              cat<std::__cxx11::string,char[4],std::__cxx11::string>
                        ((string *)((long)local_88 + 0x18U),(wabt *)local_f8._0_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                         (char (*) [4])&local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000084,OVar18.enum_));
              std::__cxx11::string::operator=
                        ((string *)&local_128,(string *)((long)local_88 + 0x18U));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
            }
            __return_storage_ptr__ = (Value *)((long)local_88 + 0x18);
            DecompileExpr(__return_storage_ptr__,this,
                          (addr_exp->children).
                          super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                          super__Vector_impl_data._M_start,addr_exp);
            Value::operator=(val,__return_storage_ptr__);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__return_storage_ptr__);
            sVar22 = local_108;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f8);
        }
      }
    }
  }
  BracketIfNeeded(this,val,Indexing);
  cat<char[2],std::__cxx11::string,char[2]>
            ((string *)local_f8,(wabt *)0x186018,(char (*) [2])&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18531d,
             (char (*) [2])CONCAT44(in_register_00000084,OVar18.enum_));
  std::__cxx11::string::_M_append
            ((char *)((val->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (sVar22 == 0) {
    local_100 = (char *)CONCAT44(local_100._4_4_,opc.enum_);
    if (0xfffffffd < (uint)op_type.enum_) {
      Opcode::GetInfo((Info *)local_f8,(Opcode *)&local_100);
      local_70._M_dataplus._M_p = (pointer)local_f8._0_8_;
      local_70._M_string_length = strlen((char *)local_f8._0_8_);
      local_f8._0_16_ =
           (undefined1  [16])
           string_view::substr((string_view *)((long)local_88 + 0x18),
                               local_70._M_string_length + 0xffffffffffffffe0 + 0x1e,
                               0xffffffffffffffff);
      s.size_ = 2;
      s.data_ = "_u";
      iVar10 = string_view::compare((string_view *)local_f8,s);
      Opcode::GetInfo((Info *)local_f8,(Opcode *)&local_100);
      if (local_d8 == 4) {
        op_type.enum_ = -(uint)(iVar10 != 0) | I32U;
      }
      else if (local_d8 == 2) {
        op_type.enum_ = I16;
        if (iVar10 == 0) {
          op_type.enum_ = I16U;
        }
      }
      else if ((local_d8 == 1) && (op_type.enum_ = I8, iVar10 == 0)) {
        op_type.enum_ = I8U;
      }
    }
    switch(op_type.enum_) {
    case I8U:
      local_100 = "ubyte";
      break;
    case I16U:
      local_100 = "ushort";
      break;
    case I32U:
      local_100 = "uint";
      break;
    case ExnRef:
      local_100 = "exnref";
      break;
    case 0xffffffe9:
    case 0xffffffea:
    case 0xffffffeb:
    case ExnRef|I8U:
    case 0xffffffed:
    case ExnRef|I16U:
    case 0xfffffff1:
    case 0xfffffff2:
    case 0xfffffff3:
    case FuncRef|I8U:
    case 0xfffffff5:
    case FuncRef|I16U:
    case FuncRef|I32U:
    case ~I32U:
    case Any:
    case ~I64:
    case ~F32:
    case ~F64:
    case ~I8:
switchD_0015827d_caseD_ffffffe9:
      local_100 = "ILLEGAL";
      break;
    case ExternRef:
      local_100 = "externref";
      break;
    case FuncRef:
      local_100 = "funcref";
      break;
    case I16:
      local_100 = "short";
      break;
    case I8:
      local_100 = "byte";
      break;
    case V128:
      local_100 = "simd";
      break;
    case F64:
      local_100 = "double";
      break;
    case F32:
      local_100 = "float";
      break;
    case I64:
      local_100 = "long";
      break;
    case I32:
      local_100 = "int";
      break;
    default:
      if (op_type.enum_ == Void) {
        local_100 = "void";
      }
      else {
        if (op_type.enum_ != Func) goto switchD_0015827d_caseD_ffffffe9;
        local_100 = "func";
      }
    }
    LoadStoreTracking::GenAlign_abi_cxx11_((string *)((long)local_88 + 0x18U),&this->lst,align,opc);
    cat<char[2],char_const*,std::__cxx11::string>
              ((string *)local_f8,(wabt *)":",(char (*) [2])&local_100,
               (char **)((long)local_88 + 0x18U),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar18.enum_));
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  val->precedence = Indexing;
  psVar8 = &local_128;
  _Var17._M_p = local_128._M_dataplus._M_p;
LAB_001583a1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var17._M_p != &psVar8->field_2) {
    operator_delete(_Var17._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadStore(Value &val, const Node& addr_exp, uint64_t offset,
                  Opcode opc, Address align, Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base &&
            abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value { { dat->name }, Precedence::Atomic };
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                ? std::to_string(offset / align)
                : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add &&
          shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl &&
            const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() +=
        cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
            lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }